

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpluginloader.cpp
# Opt level: O0

bool __thiscall QPluginLoader::unload(QPluginLoader *this)

{
  long lVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  UnloadFlag in_stack_00000014;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[0x18] & 1U) == 0) {
    if (*(long *)(in_RDI + 0x10) != 0) {
      tr(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
         in_stack_ffffffffffffffbc);
      QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                         (QString *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      QString::~QString((QString *)0x45bdae);
    }
    local_21 = false;
  }
  else {
    in_RDI[0x18] = '\0';
    local_21 = QLibraryPrivate::unload((QLibraryPrivate *)this,in_stack_00000014);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QPluginLoader::unload()
{
    if (did_load) {
        did_load = false;
        return d->unload();
    }
    if (d) // Ouch
        d->errorString = tr("The plugin was not loaded.");
    return false;
}